

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O2

scfx_rep * sc_dt::div_scfx_rep(scfx_rep *lhs,scfx_rep *rhs,int div_wl)

{
  uint *puVar1;
  uint uVar2;
  word *pwVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  scfx_rep *this;
  scfx_index sVar8;
  scfx_index sVar9;
  uint uVar10;
  scfx_rep_node *node;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  scfx_rep remainder;
  scfx_index x;
  
  this = (scfx_rep *)scfx_rep::operator_new((scfx_rep *)0x28,(size_t)rhs);
  scfx_rep::scfx_rep(this);
  if ((((lhs->m_state == not_a_number) || (rhs->m_state == not_a_number)) ||
      (rhs->m_state == infinity && lhs->m_state == infinity)) ||
     ((bVar4 = scfx_rep::is_zero(lhs), bVar4 && (bVar4 = scfx_rep::is_zero(rhs), bVar4)))) {
    scfx_rep::set_nan(this);
  }
  else {
    if ((lhs->m_state != infinity) && (bVar4 = scfx_rep::is_zero(rhs), !bVar4)) {
      bVar4 = scfx_rep::is_zero(lhs);
      if ((bVar4) || (rhs->m_state == infinity)) {
        scfx_rep::set_zero(this,rhs->m_sign * lhs->m_sign);
        return this;
      }
      iVar5 = (div_wl + 0x20) / 0x20;
      iVar11 = 3;
      if (3 < iVar5) {
        iVar11 = iVar5;
      }
      scfx_mant::resize_to((scfx_mant *)this,iVar11 + 1,0);
      scfx_mant::clear((scfx_mant *)this);
      this->m_sign = rhs->m_sign * lhs->m_sign;
      iVar6 = scfx_find_msb((ulong)(lhs->m_mant).m_array[lhs->m_msw]);
      iVar11 = lhs->m_msw;
      iVar5 = lhs->m_wp;
      iVar7 = scfx_find_msb((ulong)(rhs->m_mant).m_array[rhs->m_msw]);
      iVar5 = (iVar6 - iVar7) + ((rhs->m_wp - rhs->m_msw) + (iVar11 - iVar5)) * 0x20;
      uVar10 = iVar5 % 0x20;
      iVar11 = ((int)~uVar10 >> 0x1f) + (this->m_mant).m_size;
      this->m_wp = iVar5 / -0x20 + iVar11;
      scfx_rep::scfx_rep(&remainder,lhs);
      scfx_rep::lshift(&remainder,-uVar10);
      if (remainder.m_msw == remainder.m_mant.m_size + -1) {
        scfx_mant::resize_to(&remainder.m_mant,remainder.m_mant.m_size + 1,1);
      }
      iVar5 = rhs->m_msw - remainder.m_msw;
      if (iVar5 != 0 && remainder.m_msw <= rhs->m_msw) {
        scfx_rep::resize_to(&remainder,iVar5 + remainder.m_mant.m_size,-1);
      }
      iVar5 = div_wl + 1;
      iVar11 = iVar11 * 0x20 + uVar10;
      while (bVar4 = iVar5 != 0, iVar5 = iVar5 + -1, bVar4) {
        bVar4 = scfx_rep::is_zero(&remainder);
        if (bVar4) goto LAB_001c8210;
        iVar6 = compare_msw_ff(rhs,&remainder);
        if (iVar6 < 1) {
          puVar1 = (this->m_mant).m_array + (iVar11 >> 5);
          *puVar1 = *puVar1 | 1 << ((byte)iVar11 & 0x1f);
          iVar6 = rhs->m_lsw;
          iVar7 = rhs->m_msw - iVar6;
          iVar12 = remainder.m_msw - iVar7;
          pwVar3 = (rhs->m_mant).m_array;
          lVar13 = 0;
          uVar10 = 0;
          do {
            uVar14 = uVar10;
            uVar2 = remainder.m_mant.m_array[iVar12 + lVar13];
            uVar10 = pwVar3[iVar6 + lVar13];
            uVar15 = uVar10 + uVar14;
            remainder.m_mant.m_array[iVar12 + lVar13] = uVar2 - uVar15;
            lVar13 = lVar13 + 1;
            uVar10 = (uint)CARRY4(uVar10,uVar14) + (uint)(uVar2 < uVar15);
          } while (iVar7 + 1 != (int)lVar13);
          if ((uVar15 < uVar14) || (uVar2 < uVar15)) {
            remainder.m_mant.m_array[(long)remainder.m_msw + 1] = 0;
          }
        }
        scfx_rep::shift_left(&remainder,1);
        remainder.m_lsw = scfx_rep::find_lsw(&remainder);
        iVar11 = iVar11 + -1;
      }
      iVar11 = iVar11 + this->m_wp * -0x20;
      sVar8 = scfx_rep::calc_indices(this,iVar11 + 1);
      x = sVar8;
      sVar9 = scfx_rep::calc_indices(this,iVar11 + 2);
      pwVar3 = (this->m_mant).m_array;
      if (((pwVar3[sVar8.m_wi] >> (sVar8.m_bi & 0x1fU) & 1) != 0) &&
         ((pwVar3[sVar9.m_wi] >> (sVar9.m_bi & 0x1fU) & 1) != 0)) {
        scfx_rep::q_incr(this,&x);
      }
      this->m_r_flag = true;
LAB_001c8210:
      scfx_rep::find_sw(this);
      scfx_mant::~scfx_mant(&remainder.m_mant);
      return this;
    }
    scfx_rep::set_inf(this,rhs->m_sign * lhs->m_sign);
  }
  return this;
}

Assistant:

scfx_rep*
div_scfx_rep( const scfx_rep& lhs, const scfx_rep& rhs, int div_wl )
{
    scfx_rep& result = *new scfx_rep;

    //
    // check for special cases
    //

    if( lhs.is_nan() || rhs.is_nan() || (lhs.is_inf() && rhs.is_inf()) ||
	(lhs.is_zero() && rhs.is_zero()) )
    {
	result.set_nan();
	return &result;
    }

    if( lhs.is_inf() || rhs.is_zero() )
    {
	result.set_inf( lhs.m_sign * rhs.m_sign );
	return &result;
    }

    if( lhs.is_zero() || rhs.is_inf() )
    {
	result.set_zero( lhs.m_sign * rhs.m_sign );
	return &result;
    }

    //
    // do it
    //

    // compute one bit more for rounding
    div_wl ++;

    result.resize_to( sc_max( n_word( div_wl ) + 1, min_mant ) );
    result.m_mant.clear();
    result.m_sign = lhs.m_sign * rhs.m_sign;

    int msb_lhs = scfx_find_msb( lhs.m_mant[lhs.m_msw] )
	        + ( lhs.m_msw - lhs.m_wp ) * bits_in_word;
    int msb_rhs = scfx_find_msb( rhs.m_mant[rhs.m_msw] )
	        + ( rhs.m_msw - rhs.m_wp ) * bits_in_word;

    int msb_res = msb_lhs - msb_rhs;
    int to_shift = -msb_res % bits_in_word;
    int result_index;

    int c = ( msb_res % bits_in_word >= 0 ) ? 1 : 0;

    result_index = (result.size() - c) * bits_in_word + msb_res % bits_in_word;
    result.m_wp   = (result.size() - c) - msb_res / bits_in_word;

    scfx_rep remainder = lhs;

    // align msb from remainder to msb from rhs
    remainder.lshift( to_shift );

    // make sure msw( remainder ) < size - 1
    if( remainder.m_msw == remainder.size() - 1 )
	remainder.resize_to( remainder.size() + 1, 1 );

    // make sure msw( remainder ) >= msw( rhs )!
    int msw_diff = rhs.m_msw - remainder.m_msw;
    if (msw_diff > 0)
	remainder.resize_to( remainder.size() + msw_diff, -1 );

    int counter;

    for( counter = div_wl; counter && ! remainder.is_zero(); counter -- )
    {
	if( compare_msw_ff( rhs, remainder ) <= 0 )
	{
	    result.set_bin( result_index );
	    sub_with_index( remainder.m_mant, remainder.m_msw, remainder.m_lsw,
			    rhs.m_mant, rhs.m_msw, rhs.m_lsw );
	}
	result_index --;
	remainder.shift_left( 1 );
        remainder.m_lsw = remainder.find_lsw();
    }

    // perform convergent rounding, if needed
    if( counter == 0 )
    {
	int index = result_index + 1 - result.m_wp * bits_in_word;

	scfx_index x = result.calc_indices( index );
	scfx_index x1 = result.calc_indices( index + 1 );

	if( result.o_bit_at( x ) && result.o_bit_at( x1 ) )
	    result.q_incr( x );

	result.m_r_flag = true;
    }

    result.find_sw();

    return &result;
}